

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixAccess(sqlite3_vfs *NotUsed,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  stat buf;
  undefined1 auStack_a8 [48];
  long local_78;
  
  uVar2 = 6;
  if (flags != 1) {
    uVar2 = 0;
  }
  uVar3 = 4;
  if (flags != 2) {
    uVar3 = uVar2;
  }
  iVar1 = (*aSyscall[2].pCurrent)(zPath,uVar3);
  *pResOut = (uint)(iVar1 == 0);
  if (flags == 0 && iVar1 == 0) {
    iVar1 = (*aSyscall[4].pCurrent)(zPath,auStack_a8);
    if ((iVar1 == 0) && (local_78 == 0)) {
      *pResOut = 0;
    }
  }
  return 0;
}

Assistant:

static int unixAccess(
  sqlite3_vfs *NotUsed,   /* The VFS containing this xAccess method */
  const char *zPath,      /* Path of the file to examine */
  int flags,              /* What do we want to learn about the zPath file? */
  int *pResOut            /* Write result boolean here */
){
  int amode = 0;
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError( return SQLITE_IOERR_ACCESS; );
  switch( flags ){
    case SQLITE_ACCESS_EXISTS:
      amode = F_OK;
      break;
    case SQLITE_ACCESS_READWRITE:
      amode = W_OK|R_OK;
      break;
    case SQLITE_ACCESS_READ:
      amode = R_OK;
      break;

    default:
      assert(!"Invalid flags argument");
  }
  *pResOut = (osAccess(zPath, amode)==0);
  if( flags==SQLITE_ACCESS_EXISTS && *pResOut ){
    struct stat buf;
    if( 0==osStat(zPath, &buf) && buf.st_size==0 ){
      *pResOut = 0;
    }
  }
  return SQLITE_OK;
}